

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O2

void TRM::LinkedList<TRM::Edge>::Remove<&TRM::Edge::above_prev,&TRM::Edge::above_next>
               (Edge *t,Edge **head,Edge **tail)

{
  Edge *pEVar1;
  Edge **ppEVar2;
  
  if (t->above_prev == (Edge *)0x0) {
    pEVar1 = t->above_next;
    if (head != (Edge **)0x0) {
      *head = pEVar1;
    }
  }
  else {
    pEVar1 = t->above_next;
    t->above_prev->above_next = pEVar1;
  }
  ppEVar2 = &t->above_prev;
  if (pEVar1 == (Edge *)0x0) {
    if (tail != (Edge **)0x0) {
      *tail = *ppEVar2;
    }
  }
  else {
    pEVar1->above_prev = *ppEVar2;
  }
  *ppEVar2 = (Edge *)0x0;
  t->above_next = (Edge *)0x0;
  return;
}

Assistant:

static void Remove(T* t, T** head, T** tail) {
    if (t->*Prev) {
      t->*Prev->*Next = t->*Next;
    } else if (head) {
      *head = t->*Next;
    }

    if (t->*Next) {
      t->*Next->*Prev = t->*Prev;
    } else if (tail) {
      *tail = t->*Prev;
    }

    t->*Prev = t->*Next = nullptr;
  }